

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model::Model(Model *this,char *path)

{
  string local_48;
  allocator<char> local_21;
  
  (this->meshes).super__Vector_base<Mesh,_std::allocator<Mesh>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->meshes).super__Vector_base<Mesh,_std::allocator<Mesh>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->textures_loaded).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->meshes).super__Vector_base<Mesh,_std::allocator<Mesh>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->textures_loaded).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures_loaded).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->directory)._M_dataplus._M_p = (pointer)&(this->directory).field_2;
  (this->directory)._M_string_length = 0;
  (this->directory).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,path,&local_21);
  load_model(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

Model::Model(const char* path){
    load_model(std::string(path));
}